

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.cpp
# Opt level: O3

void __thiscall aeron::Subscription::~Subscription(Subscription *this)

{
  pointer pcVar1;
  
  this->_vptr_Subscription = (_func_int **)&PTR__Subscription_00186cd0;
  ClientConductor::releaseSubscription
            (this->m_conductor,this->m_registrationId,(this->m_imageList)._M_b._M_p);
  pcVar1 = (this->m_channel)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_channel).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Subscription::~Subscription()
{
    m_conductor.releaseSubscription(m_registrationId, std::atomic_load_explicit(&m_imageList, std::memory_order_acquire));
}